

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::AppendExpr
          (BinaryReaderIR *this,unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *expr)

{
  Expr *pEVar1;
  intrusive_list<wabt::Expr> *this_00;
  Result RVar2;
  Enum EVar3;
  _Head_base<0UL,_wabt::Expr_*,_false> local_40;
  LabelNode *label;
  char *pcStack_30;
  anon_union_16_2_ecfd7102_for_Location_1 local_28;
  
  GetLocation((Location *)&label,this);
  pEVar1 = (expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
           super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
           super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
  (pEVar1->loc).field_1.field_1.offset = (size_t)local_28.field_1.offset;
  *(undefined8 *)((long)&(pEVar1->loc).field_1 + 8) = local_28._8_8_;
  (pEVar1->loc).filename._M_len = (size_t)label;
  (pEVar1->loc).filename._M_str = pcStack_30;
  RVar2 = TopLabel(this,&label);
  if (RVar2.enum_ == Error) {
    EVar3 = Error;
  }
  else {
    this_00 = label->exprs;
    local_40._M_head_impl =
         (expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
         super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
         super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)0x0;
    intrusive_list<wabt::Expr>::push_back
              (this_00,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_40);
    EVar3 = Ok;
    if (local_40._M_head_impl != (Expr *)0x0) {
      (*(local_40._M_head_impl)->_vptr_Expr[1])();
      EVar3 = Ok;
    }
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderIR::AppendExpr(std::unique_ptr<Expr> expr) {
  expr->loc = GetLocation();
  LabelNode* label;
  CHECK_RESULT(TopLabel(&label));
  label->exprs->push_back(std::move(expr));
  return Result::Ok;
}